

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O3

void __thiscall
HFactor::reportDoubleVector
          (HFactor *this,string *name,vector<double,_std::allocator<double>_> *entry)

{
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  
  pdVar1 = (entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar1) >> 3;
  uVar2 = (uint)uVar3;
  printf("%-12s: siz %4d; cap %4d: ",(name->_M_dataplus)._M_p,uVar3 & 0xffffffff,
         (ulong)((long)(entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pdVar1) >> 3);
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if ((uVar3 != 0) && ((int)uVar3 + (int)((uVar3 & 0xffffffff) / 10) * -10 == 0)) {
        printf("\n                                  ");
      }
      printf("%11.4g ",
             (entry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
  }
  putchar(10);
  return;
}

Assistant:

void HFactor::reportDoubleVector(const std::string name,
                                 const vector<double> entry) const {
  const HighsInt num_en = entry.size();
  printf("%-12s: siz %4d; cap %4d: ", name.c_str(), (int)num_en,
         (int)entry.capacity());
  for (HighsInt iEn = 0; iEn < num_en; iEn++) {
    if (iEn > 0 && iEn % 10 == 0)
      printf("\n                                  ");
    printf("%11.4g ", entry[iEn]);
  }
  printf("\n");
}